

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O2

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::AddColumn(DuckTableEntry *this,ClientContext *context,AddColumnInfo *info)

{
  __node_base_ptr p_Var1;
  Catalog *args;
  SchemaCatalogEntry *args_1;
  bool bVar2;
  pointer pCVar3;
  ColumnDefinition *pCVar4;
  pointer pCVar5;
  Binder *pBVar6;
  LogicalType *type;
  reference this_00;
  type args_2;
  long in_RCX;
  pointer *__ptr;
  __node_base_ptr this_01;
  ColumnListIterator CVar7;
  templated_unique_single_t create_info;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  shared_ptr<duckdb::Binder,_true> binder;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  bound_defaults;
  shared_ptr<duckdb::DataTable,_true> new_storage;
  string col_name;
  ColumnDefinition col;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_358;
  undefined1 local_350 [16];
  undefined1 local_340 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_330;
  ColumnDefinition *local_328;
  undefined1 local_320 [8];
  undefined1 local_318 [16];
  __atomic_base<unsigned_long> local_308;
  idx_t local_300;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  undefined1 local_2e8 [16];
  string local_2d8;
  ColumnDefinition local_2b8;
  ColumnDefinition local_1e0;
  ColumnDefinition local_108;
  
  local_328 = (ColumnDefinition *)(in_RCX + 0x78);
  local_350._8_8_ = this;
  local_320 = (undefined1  [8])info;
  ColumnDefinition::GetName_abi_cxx11_((string *)(local_2e8 + 0x10),local_328);
  if (*(char *)(in_RCX + 0x150) == '\x01') {
    bVar2 = ColumnList::ColumnExists
                      ((ColumnList *)&(context->config).asof_loop_join_threshold,
                       (string *)(local_2e8 + 0x10));
    if (bVar2) {
      *(undefined8 *)local_350._8_8_ = 0;
      goto LAB_015eeadb;
    }
  }
  make_uniq<duckdb::CreateTableInfo,duckdb::SchemaCatalogEntry&,std::__cxx11::string&>
            ((duckdb *)&local_358,
             *(SchemaCatalogEntry **)&(context->config).query_verification_enabled,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &context->interrupted);
  bVar2 = *(bool *)((long)&(context->config).home_directory._M_string_length + 1);
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_358);
  (pCVar3->super_CreateInfo).temporary = bVar2;
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_358);
  Value::operator=(&(pCVar3->super_CreateInfo).comment,
                   (Value *)((long)&(context->config).home_directory.field_2 + 8));
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_358);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(pCVar3->super_CreateInfo).tags,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&(context->config).profiler_settings._M_h._M_before_begin);
  CVar7 = ColumnList::Logical((ColumnList *)&(context->config).asof_loop_join_threshold);
  local_340._8_8_ = CVar7.list;
  local_330._M_pi._0_1_ = CVar7.physical;
  ColumnList::ColumnListIterator::begin
            ((ColumnLogicalIteratorInternal *)&local_2b8,(ColumnListIterator *)(local_340 + 8));
  ColumnList::ColumnListIterator::end
            ((ColumnLogicalIteratorInternal *)local_318,(ColumnListIterator *)(local_340 + 8));
  while (((local_2b8.name.field_2._M_allocated_capacity != local_308._M_i ||
          (local_2b8.name.field_2._8_8_ != local_300)) ||
         (local_2b8.name._M_dataplus._M_p != (pointer)local_318._0_8_))) {
    pCVar4 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                       ((ColumnLogicalIteratorInternal *)&local_2b8);
    pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_358);
    ColumnDefinition::Copy(&local_108,pCVar4);
    ColumnList::AddColumn(&pCVar3->columns,&local_108);
    ColumnDefinition::~ColumnDefinition(&local_108);
    local_2b8.name.field_2._M_allocated_capacity = local_2b8.name.field_2._M_allocated_capacity + 1;
  }
  p_Var1 = (context->config).set_variables._M_h._M_single_bucket;
  for (this_01 = (__node_base_ptr)
                 (context->config).set_variables._M_h._M_rehash_policy._M_next_resize;
      this_01 != p_Var1; this_01 = this_01 + 1) {
    pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_358);
    pCVar5 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
             operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                         *)this_01);
    (*pCVar5->_vptr_Constraint[3])(&local_2b8,pCVar5);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                *)&pCVar3->constraints,
               (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
               &local_2b8);
    if ((long *)local_2b8.name._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2b8.name._M_dataplus._M_p + 8))();
    }
  }
  Binder::CreateBinder
            ((Binder *)(local_340 + 8),(ClientContext *)local_320,
             (optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)(local_340 + 8));
  pCVar4 = local_328;
  type = ColumnDefinition::TypeMutable(local_328);
  Binder::BindLogicalType
            (pBVar6,type,(Catalog *)(context->config).max_expression_depth,
             (string *)(*(long *)&(context->config).query_verification_enabled + 0x20));
  ColumnDefinition::SetOid
            (pCVar4,(long)((context->config).streaming_buffer_size -
                          (context->config).asof_loop_join_threshold) / 0xd8);
  ColumnDefinition::SetStorageOid
            (pCVar4,(long)((long)(context->config).set_variables._M_h._M_before_begin._M_nxt -
                          (context->config).set_variables._M_h._M_bucket_count) >> 3);
  ColumnDefinition::Copy(&local_2b8,pCVar4);
  pCVar3 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_358);
  ColumnDefinition::ColumnDefinition(&local_1e0,&local_2b8);
  ColumnList::AddColumn(&pCVar3->columns,&local_1e0);
  ColumnDefinition::~ColumnDefinition(&local_1e0);
  local_318._0_8_ = (ColumnList *)0x0;
  local_318._8_8_ = (pointer)0x0;
  local_308._M_i = 0;
  pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->
                     ((shared_ptr<duckdb::Binder,_true> *)(local_340 + 8));
  local_350._0_8_ = local_358._M_head_impl;
  local_358._M_head_impl = (CreateTableInfo *)0x0;
  Binder::BindCreateTableInfo
            ((Binder *)local_340,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)pBVar6
             ,(SchemaCatalogEntry *)local_350,
             *(vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               **)&(context->config).query_verification_enabled);
  if ((CreateTableInfo *)local_350._0_8_ != (CreateTableInfo *)0x0) {
    (*(((CreateInfo *)local_350._0_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_350._0_8_ = (_func_int **)0x0;
  pCVar4 = (ColumnDefinition *)
           shared_ptr<duckdb::DataTable,_true>::operator*
                     ((shared_ptr<duckdb::DataTable,_true> *)
                      &(context->config).user_variables._M_h._M_bucket_count);
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                    *)local_318);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*(this_00);
  make_shared_ptr<duckdb::DataTable,duckdb::ClientContext&,duckdb::DataTable&,duckdb::ColumnDefinition&,duckdb::Expression&>
            ((ClientContext *)local_2e8,(DataTable *)local_320,pCVar4,(Expression *)local_328);
  args = (Catalog *)(context->config).max_expression_depth;
  args_1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  args_2 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
           ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                        *)local_340);
  make_uniq<duckdb::DuckTableEntry,duckdb::Catalog&,duckdb::SchemaCatalogEntry&,duckdb::BoundCreateTableInfo&,duckdb::shared_ptr<duckdb::DataTable,true>&>
            ((duckdb *)&local_2f0,args,args_1,args_2,
             (shared_ptr<duckdb::DataTable,_true> *)local_2e8);
  *(_func_int ***)local_350._8_8_ = (_func_int **)local_2f0._M_pi;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2e8 + 8));
  ::std::
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>::
  ~unique_ptr((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
               *)local_340);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)local_318);
  ColumnDefinition::~ColumnDefinition(&local_2b8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_330);
  if (local_358._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_358._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
LAB_015eeadb:
  ::std::__cxx11::string::~string((string *)(local_2e8 + 0x10));
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (_Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)
         local_350._8_8_;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::AddColumn(ClientContext &context, AddColumnInfo &info) {
	auto col_name = info.new_column.GetName();

	// We're checking for the opposite condition (ADD COLUMN IF _NOT_ EXISTS ...).
	if (info.if_column_not_exists && ColumnExists(col_name)) {
		return nullptr;
	}

	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->temporary = temporary;
	create_info->comment = comment;
	create_info->tags = tags;

	for (auto &col : columns.Logical()) {
		create_info->columns.AddColumn(col.Copy());
	}
	for (auto &constraint : constraints) {
		create_info->constraints.push_back(constraint->Copy());
	}
	auto binder = Binder::CreateBinder(context);
	binder->BindLogicalType(info.new_column.TypeMutable(), &catalog, schema.name);
	info.new_column.SetOid(columns.LogicalColumnCount());
	info.new_column.SetStorageOid(columns.PhysicalColumnCount());
	auto col = info.new_column.Copy();

	create_info->columns.AddColumn(std::move(col));

	vector<unique_ptr<Expression>> bound_defaults;
	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema, bound_defaults);
	auto new_storage = make_shared_ptr<DataTable>(context, *storage, info.new_column, *bound_defaults.back());
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, new_storage);
}